

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O0

void process_data_simple_main
               (j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
               JDIMENSION in_rows_avail)

{
  long lVar1;
  int iVar2;
  undefined4 in_ECX;
  int *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  my_main_ptr main;
  
  lVar1 = *(long *)(in_RDI + 0x1f8);
  while( true ) {
    if (*(uint *)(in_RDI + 0x16c) <= *(uint *)(lVar1 + 0x10)) {
      return;
    }
    if (*(uint *)(lVar1 + 0x14) < *(uint *)(in_RDI + 0x168)) {
      (**(code **)(*(long *)(in_RDI + 0x200) + 8))
                (in_RDI,in_RSI,in_RDX,in_ECX,lVar1 + 0x20,lVar1 + 0x14,
                 *(undefined4 *)(in_RDI + 0x168));
    }
    if (*(int *)(lVar1 + 0x14) != *(int *)(in_RDI + 0x168)) break;
    iVar2 = (**(code **)(*(long *)(in_RDI + 0x208) + 8))(in_RDI,lVar1 + 0x20);
    if (iVar2 == 0) {
      if (*(int *)(lVar1 + 0x18) != 0) {
        return;
      }
      *in_RDX = *in_RDX + -1;
      *(undefined4 *)(lVar1 + 0x18) = 1;
      return;
    }
    if (*(int *)(lVar1 + 0x18) != 0) {
      *in_RDX = *in_RDX + 1;
      *(undefined4 *)(lVar1 + 0x18) = 0;
    }
    *(undefined4 *)(lVar1 + 0x14) = 0;
    *(int *)(lVar1 + 0x10) = *(int *)(lVar1 + 0x10) + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_simple_main (j_compress_ptr cinfo,
			  JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
			  JDIMENSION in_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;

  while (main->cur_iMCU_row < cinfo->total_iMCU_rows) {
    /* Read input data if we haven't filled the main buffer yet */
    if (main->rowgroup_ctr < (JDIMENSION) cinfo->min_DCT_v_scaled_size)
      (*cinfo->prep->pre_process_data) (cinfo,
					input_buf, in_row_ctr, in_rows_avail,
					main->buffer, &main->rowgroup_ctr,
					(JDIMENSION) cinfo->min_DCT_v_scaled_size);

    /* If we don't have a full iMCU row buffered, return to application for
     * more data.  Note that preprocessor will always pad to fill the iMCU row
     * at the bottom of the image.
     */
    if (main->rowgroup_ctr != (JDIMENSION) cinfo->min_DCT_v_scaled_size)
      return;

    /* Send the completed row to the compressor */
    if (! (*cinfo->coef->compress_data) (cinfo, main->buffer)) {
      /* If compressor did not consume the whole row, then we must need to
       * suspend processing and return to the application.  In this situation
       * we pretend we didn't yet consume the last input row; otherwise, if
       * it happened to be the last row of the image, the application would
       * think we were done.
       */
      if (! main->suspended) {
	(*in_row_ctr)--;
	main->suspended = TRUE;
      }
      return;
    }
    /* We did finish the row.  Undo our little suspension hack if a previous
     * call suspended; then mark the main buffer empty.
     */
    if (main->suspended) {
      (*in_row_ctr)++;
      main->suspended = FALSE;
    }
    main->rowgroup_ctr = 0;
    main->cur_iMCU_row++;
  }
}